

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  long *local_70;
  ptls_key_exchange_algorithm_t **c;
  uint8_t *puStack_60;
  uint16_t group;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t *puStack_30;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_key_exchange_algorithm_t **candidates_local;
  ptls_key_exchange_algorithm_t **selected_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    end_local = src;
    do {
      puStack_60 = end_local + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end_local;
      _block_size = _block_size - 1;
      end_local = puStack_60;
    } while (_block_size != 0);
    if ((ulong)((long)end - (long)puStack_60) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puStack_60 = puStack_60 + _block_size64;
      _block_size = 0;
      puStack_30 = end;
      src_local = (uint8_t *)candidates;
      candidates_local = selected;
      while (end_local != puStack_60) {
        iVar1 = ptls_decode16((uint16_t *)((long)&c + 6),&end_local,puStack_60);
        if (iVar1 != 0) {
          return iVar1;
        }
        for (local_70 = (long *)src_local; *local_70 != 0; local_70 = local_70 + 1) {
          if (*(short *)*local_70 == c._6_2_) {
            *candidates_local = (ptls_key_exchange_algorithm_t *)*local_70;
            return 0;
          }
        }
        _capacity._4_4_ = 0;
      }
      if (end_local == puStack_60) {
        if (end_local == puStack_30) {
          _capacity._4_4_ = 0x28;
        }
        else {
          _capacity._4_4_ = 0x32;
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int select_negotiated_group(ptls_key_exchange_algorithm_t **selected, ptls_key_exchange_algorithm_t **candidates,
                                   const uint8_t *src, const uint8_t *const end)
{
    int ret;

    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            if ((ret = ptls_decode16(&group, &src, end)) != 0)
                goto Exit;
            ptls_key_exchange_algorithm_t **c = candidates;
            for (; *c != NULL; ++c) {
                if ((*c)->id == group) {
                    *selected = *c;
                    return 0;
                }
            }
        }
    });

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}